

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddTable.c
# Opt level: O0

DdNode * cuddUniqueInterIVO(DdManager *unique,int index,DdNode *T,DdNode *E)

{
  DdNode *f;
  DdNode *v;
  DdNode *result;
  DdNode *E_local;
  DdNode *T_local;
  int index_local;
  DdManager *unique_local;
  
  f = cuddUniqueInter(unique,index,unique->one,(DdNode *)((ulong)unique->one ^ 1));
  if (f == (DdNode *)0x0) {
    unique_local = (DdManager *)0x0;
  }
  else {
    *(int *)(((ulong)f & 0xfffffffffffffffe) + 4) =
         *(int *)(((ulong)f & 0xfffffffffffffffe) + 4) + 1;
    unique_local = (DdManager *)cuddBddIteRecur(unique,f,T,E);
    Cudd_RecursiveDeref(unique,f);
  }
  return &unique_local->sentinel;
}

Assistant:

DdNode *
cuddUniqueInterIVO(
  DdManager * unique,
  int  index,
  DdNode * T,
  DdNode * E)
{
    DdNode *result;
    DdNode *v;

    v = cuddUniqueInter(unique, index, DD_ONE(unique),
                        Cudd_Not(DD_ONE(unique)));
    if (v == NULL)
        return(NULL);
    cuddRef(v);
    result = cuddBddIteRecur(unique, v, T, E);
    Cudd_RecursiveDeref(unique, v);
    return(result);
}